

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,TextureTestBase *this,GLuint test_case_index,
          ProgramInterface *program_interface,VaryingPassthrough *varying_passthrough,STAGES stage)

{
  int iVar1;
  char *pcVar2;
  size_t position;
  size_t local_a0;
  GLchar *local_98;
  GLchar *local_90;
  long local_88;
  GLchar *local_70 [4];
  string local_50;
  
  local_98 = getShaderTemplate((TextureTestBase *)__return_storage_ptr__,stage);
  Utils::ProgramInterface::GetInterfaceForStage_abi_cxx11_(&local_50,program_interface,stage);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&local_90,this,(ulong)test_case_index,program_interface,(ulong)stage);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xd])
            (local_70,this,(ulong)test_case_index,varying_passthrough,(ulong)stage);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_98,(allocator<char> *)&local_a0);
  local_a0 = 0;
  if (stage == GEOMETRY) {
    iVar1 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
              [0x20])(this,(ulong)test_case_index);
    pcVar2 = "out gl_PerVertex {\nvec4 gl_Position;\n};\n\n";
    if ((char)iVar1 != '\0') {
      pcVar2 = glcts::fixed_sample_locations_values + 1;
    }
    Utils::replaceToken("PERVERTEX",&local_a0,pcVar2,__return_storage_ptr__);
  }
  Utils::replaceToken("INTERFACE",&local_a0,local_50._M_dataplus._M_p,__return_storage_ptr__);
  Utils::replaceToken("VERIFICATION",&local_a0,local_90,__return_storage_ptr__);
  pcVar2 = "    else ";
  if (local_88 == 0) {
    pcVar2 = glcts::fixed_sample_locations_values + 1;
  }
  Utils::replaceAllTokens("ELSE",pcVar2,__return_storage_ptr__);
  Utils::replaceAllTokens("PASSTHROUGH",local_70[0],__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureTestBase::getShaderSource(GLuint test_case_index, Utils::ProgramInterface& program_interface,
											 Utils::VaryingPassthrough& varying_passthrough,
											 Utils::Shader::STAGES		stage)
{
	/* Get strings */
	const GLchar*	  shader_template  = getShaderTemplate(stage);
	const std::string& shader_interface = program_interface.GetInterfaceForStage(stage);

	const std::string& verification = getVerificationSnippet(test_case_index, program_interface, stage);

	const std::string& passthrough = getPassSnippet(test_case_index, varying_passthrough, stage);

	const GLchar* per_vertex = "";

	std::string source   = shader_template;
	size_t		position = 0;

	/* Replace tokens in template */
	if (Utils::Shader::GEOMETRY == stage)
	{
		if (false == useMonolithicProgram(test_case_index))
		{
			per_vertex = "out gl_PerVertex {\n"
						 "vec4 gl_Position;\n"
						 "};\n"
						 "\n";
		}

		Utils::replaceToken("PERVERTEX", position, per_vertex, source);
	}

	Utils::replaceToken("INTERFACE", position, shader_interface.c_str(), source);
	Utils::replaceToken("VERIFICATION", position, verification.c_str(), source);

	if (false == verification.empty())
	{
		Utils::replaceAllTokens("ELSE", "    else ", source);
	}
	else
	{
		Utils::replaceAllTokens("ELSE", "", source);
	}

	Utils::replaceAllTokens("PASSTHROUGH", passthrough.c_str(), source);

	/* Done */
	return source;
}